

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

xmlRelaxNGGrammarPtr_conflict xmlRelaxNGParseGrammar(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr nodes)

{
  xmlRelaxNGGrammarPtr pxVar1;
  xmlRelaxNGGrammarPtr pxVar2;
  int iVar3;
  int iVar4;
  xmlRelaxNGGrammarPtr_conflict pxVar5;
  xmlRelaxNGGrammarPtr *ppxVar6;
  xmlChar *str1;
  xmlRelaxNGDefinePtr_conflict pxVar7;
  xmlHashTablePtr pxVar8;
  xmlRelaxNGGrammarPtr pxVar9;
  char *msg;
  xmlNodePtr pxVar10;
  xmlChar *str1_00;
  xmlRelaxNGDefinePtr pxVar11;
  bool bVar12;
  bool bVar13;
  xmlChar local_58 [40];
  
  pxVar5 = (xmlRelaxNGGrammarPtr_conflict)(*xmlMalloc)(0x40);
  if (pxVar5 == (xmlRelaxNGGrammarPtr_conflict)0x0) {
    xmlRngPErrMemory(ctxt);
    return (xmlRelaxNGGrammarPtr_conflict)0x0;
  }
  pxVar5->defs = (xmlHashTablePtr)0x0;
  pxVar5->refs = (xmlHashTablePtr)0x0;
  *(undefined8 *)&pxVar5->combine = 0;
  pxVar5->startList = (xmlRelaxNGDefinePtr_conflict)0x0;
  pxVar5->next = (xmlRelaxNGGrammarPtr)0x0;
  pxVar5->start = (xmlRelaxNGDefinePtr_conflict)0x0;
  pxVar5->parent = (xmlRelaxNGGrammarPtr)0x0;
  pxVar5->children = (xmlRelaxNGGrammarPtr)0x0;
  pxVar1 = ctxt->grammar;
  pxVar5->parent = pxVar1;
  if (pxVar1 != (xmlRelaxNGGrammarPtr)0x0) {
    pxVar2 = pxVar1->children;
    if (pxVar1->children == (xmlRelaxNGGrammarPtr)0x0) {
      ppxVar6 = &pxVar1->children;
    }
    else {
      do {
        pxVar9 = pxVar2;
        pxVar2 = pxVar9->next;
      } while (pxVar2 != (xmlRelaxNGGrammarPtr)0x0);
      ppxVar6 = &pxVar9->next;
    }
    *ppxVar6 = pxVar5;
  }
  ctxt->grammar = pxVar5;
  xmlRelaxNGParseGrammarContent(ctxt,nodes);
  ctxt->grammar = pxVar5;
  pxVar7 = pxVar5->start;
  if (pxVar7 == (xmlRelaxNGDefinePtr_conflict)0x0) {
    xmlRngPErr(ctxt,nodes,0x40f,"Element <grammar> has no <start>\n",(xmlChar *)0x0,(xmlChar *)0x0);
    pxVar7 = pxVar5->start;
    if (pxVar7 == (xmlRelaxNGDefinePtr_conflict)0x0) goto LAB_001833de;
  }
  if (pxVar7->next != (xmlRelaxNGDefinePtr)0x0) {
    iVar4 = -1;
    bVar12 = false;
    pxVar11 = pxVar7;
    do {
      pxVar10 = pxVar11->node;
      if (pxVar10 == (xmlNodePtr)0x0) {
        pxVar10 = (xmlNodePtr)0x0;
LAB_00183259:
        xmlRngPErr(ctxt,pxVar10,0x453,"Internal error: start element not found\n",(xmlChar *)0x0,
                   (xmlChar *)0x0);
LAB_00183273:
        if (bVar12) {
          xmlRngPErr(ctxt,pxVar11->node,0x41e,"Some <start> element miss the combine attribute\n",
                     (xmlChar *)0x0,(xmlChar *)0x0);
        }
        bVar12 = true;
      }
      else {
        if (pxVar10->parent == (_xmlNode *)0x0) goto LAB_00183259;
        iVar3 = xmlStrEqual(pxVar10->parent->name,(xmlChar *)"start");
        pxVar10 = pxVar11->node;
        if (iVar3 == 0) goto LAB_00183259;
        str1 = xmlGetProp(pxVar10->parent,(xmlChar *)"combine");
        if (str1 == (xmlChar *)0x0) goto LAB_00183273;
        iVar3 = xmlStrEqual(str1,(xmlChar *)"choice");
        if (iVar3 == 0) {
          iVar3 = xmlStrEqual(str1,(xmlChar *)"interleave");
          if (iVar3 == 0) {
            pxVar10 = pxVar11->node;
            iVar3 = 0x45a;
            msg = "<start> uses unknown combine value \'%s\'\'\n";
            str1_00 = str1;
            goto LAB_0018330a;
          }
          bVar13 = iVar4 == 1;
          iVar4 = 0;
          if (bVar13) {
            xmlRngPErr(ctxt,pxVar11->node,0x450,"<start> use both \'choice\' and \'interleave\'\n",
                       (xmlChar *)0x0,(xmlChar *)0x0);
            iVar4 = 1;
          }
        }
        else {
          bVar13 = iVar4 == 0;
          iVar4 = 1;
          if (bVar13) {
            pxVar10 = pxVar11->node;
            iVar4 = 0;
            iVar3 = 0x450;
            msg = "<start> use both \'choice\' and \'interleave\'\n";
            str1_00 = (xmlChar *)0x0;
LAB_0018330a:
            xmlRngPErr(ctxt,pxVar10,iVar3,msg,str1_00,(xmlChar *)0x0);
          }
        }
        (*xmlFree)(str1);
      }
      pxVar11 = pxVar11->next;
    } while (pxVar11 != (xmlRelaxNGDefinePtr)0x0);
    pxVar7 = xmlRelaxNGNewDefine(ctxt,pxVar7->node);
    if (pxVar7 != (xmlRelaxNGDefinePtr_conflict)0x0) {
      bVar12 = iVar4 + 1U < 2;
      pxVar7->type = bVar12 + 0x11 + (uint)bVar12;
      pxVar7->content = pxVar5->start;
      pxVar5->start = pxVar7;
      if (bVar12) {
        if (ctxt->interleaves == (xmlHashTablePtr)0x0) {
          pxVar8 = xmlHashCreate(10);
          ctxt->interleaves = pxVar8;
          if (pxVar8 == (xmlHashTablePtr)0x0) {
            xmlRngPErr(ctxt,pxVar7->node,0x416,"Failed to create interleaves hash table\n",
                       (xmlChar *)0x0,(xmlChar *)0x0);
            goto LAB_001833de;
          }
        }
        ctxt->nbInterleaves = ctxt->nbInterleaves + 1;
        snprintf((char *)local_58,0x20,"interleave%d");
        iVar4 = xmlHashAddEntry(ctxt->interleaves,local_58,pxVar7);
        if (iVar4 < 0) {
          xmlRngPErr(ctxt,pxVar7->node,0x416,"Failed to add %s to hash table\n",local_58,
                     (xmlChar *)0x0);
        }
      }
    }
  }
LAB_001833de:
  if (pxVar5->defs != (xmlHashTablePtr)0x0) {
    xmlHashScan(pxVar5->defs,xmlRelaxNGCheckCombine,ctxt);
  }
  if (pxVar5->refs != (xmlHashTablePtr)0x0) {
    xmlHashScan(pxVar5->refs,xmlRelaxNGCheckReference,ctxt);
  }
  ctxt->grammar = pxVar1;
  return pxVar5;
}

Assistant:

static xmlRelaxNGGrammarPtr
xmlRelaxNGParseGrammar(xmlRelaxNGParserCtxtPtr ctxt, xmlNodePtr nodes)
{
    xmlRelaxNGGrammarPtr ret, tmp, old;

    ret = xmlRelaxNGNewGrammar(ctxt);
    if (ret == NULL)
        return (NULL);

    /*
     * Link the new grammar in the tree
     */
    ret->parent = ctxt->grammar;
    if (ctxt->grammar != NULL) {
        tmp = ctxt->grammar->children;
        if (tmp == NULL) {
            ctxt->grammar->children = ret;
        } else {
            while (tmp->next != NULL)
                tmp = tmp->next;
            tmp->next = ret;
        }
    }

    old = ctxt->grammar;
    ctxt->grammar = ret;
    xmlRelaxNGParseGrammarContent(ctxt, nodes);
    ctxt->grammar = ret;
    if (ctxt->grammar == NULL) {
        xmlRngPErr(ctxt, nodes, XML_RNGP_GRAMMAR_CONTENT,
                   "Failed to parse <grammar> content\n", NULL, NULL);
    } else if (ctxt->grammar->start == NULL) {
        xmlRngPErr(ctxt, nodes, XML_RNGP_GRAMMAR_NO_START,
                   "Element <grammar> has no <start>\n", NULL, NULL);
    }

    /*
     * Apply 4.17 merging rules to defines and starts
     */
    xmlRelaxNGCombineStart(ctxt, ret);
    if (ret->defs != NULL) {
        xmlHashScan(ret->defs, xmlRelaxNGCheckCombine, ctxt);
    }

    /*
     * link together defines and refs in this grammar
     */
    if (ret->refs != NULL) {
        xmlHashScan(ret->refs, xmlRelaxNGCheckReference, ctxt);
    }


    /* @@@@ */

    ctxt->grammar = old;
    return (ret);
}